

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFileBase.cpp
# Opt level: O0

char * fix_to_utf8(char *s,char **arena,char *arena_end)

{
  byte bVar1;
  void *pvVar2;
  byte *in_RDX;
  byte *pbVar3;
  undefined8 *in_RSI;
  byte *in_RDI;
  uint32_t c;
  char *begin;
  char *p;
  byte *local_28;
  byte *local_10;
  byte *local_8;
  
  pvVar2 = utf8valid(in_RDI);
  local_8 = in_RDI;
  if (pvVar2 != (void *)0x0) {
    local_8 = (byte *)*in_RSI;
    local_28 = local_8;
    for (local_10 = in_RDI; *local_10 != 0; local_10 = local_10 + 1) {
      bVar1 = *local_10;
      if (bVar1 < 0x80) {
        if (in_RDX <= local_28 + 1) goto LAB_0015658a;
        *local_28 = bVar1;
        local_28 = local_28 + 1;
      }
      else {
        if (in_RDX <= local_28 + 2) goto LAB_0015658a;
        pbVar3 = local_28 + 1;
        *local_28 = bVar1 >> 6 | 0xc0;
        local_28 = local_28 + 2;
        *pbVar3 = bVar1 & 0x3f | 0x80;
      }
    }
    if (local_28 + 1 < in_RDX) {
      *local_28 = 0;
      local_28 = local_28 + 1;
    }
LAB_0015658a:
    *in_RSI = local_28;
  }
  return (char *)local_8;
}

Assistant:

char *fix_to_utf8(char *s, char **arena, char *arena_end) {
	if (!utf8valid(s)) {
		return s;
	}
	char *p     = *arena;
	char *begin = p;
	while (*s) {
		uint32_t c = (uint8_t)*s;
		if (c < 0x80) {
			if (p + 1 >= arena_end) goto done;
			*p++ = c;
		} else {
			if (p + 2 >= arena_end) goto done;
			*p++ = 0xc0 | (c >> 6);
			*p++ = 0x80 | (c & 0x3f);
		}
		++s;
	}
	if (p + 1 >= arena_end) goto done;
	*p++ = 0;
done:
	*arena = p;
	return begin;
}